

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::QuantizationParams::QuantizationParams
          (QuantizationParams *this,QuantizationParams *from)

{
  QuantizationTypeCase QVar1;
  LinearQuantizationParams *this_00;
  LinearQuantizationParams *from_00;
  LookUpTableQuantizationParams *this_01;
  LookUpTableQuantizationParams *from_01;
  QuantizationParams *from_local;
  QuantizationParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__QuantizationParams_006f3b18;
  QuantizationTypeUnion::QuantizationTypeUnion((QuantizationTypeUnion *)&this->QuantizationType_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->numberofbits_ = from->numberofbits_;
  clear_has_QuantizationType(this);
  QVar1 = QuantizationType_case(from);
  if (QVar1 != QUANTIZATIONTYPE_NOT_SET) {
    if (QVar1 == kLinearQuantization) {
      this_00 = _internal_mutable_linearquantization(this);
      from_00 = _internal_linearquantization(from);
      LinearQuantizationParams::MergeFrom(this_00,from_00);
    }
    else if (QVar1 == kLookupTableQuantization) {
      this_01 = _internal_mutable_lookuptablequantization(this);
      from_01 = _internal_lookuptablequantization(from);
      LookUpTableQuantizationParams::MergeFrom(this_01,from_01);
    }
  }
  return;
}

Assistant:

QuantizationParams::QuantizationParams(const QuantizationParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  numberofbits_ = from.numberofbits_;
  clear_has_QuantizationType();
  switch (from.QuantizationType_case()) {
    case kLinearQuantization: {
      _internal_mutable_linearquantization()->::CoreML::Specification::LinearQuantizationParams::MergeFrom(from._internal_linearquantization());
      break;
    }
    case kLookupTableQuantization: {
      _internal_mutable_lookuptablequantization()->::CoreML::Specification::LookUpTableQuantizationParams::MergeFrom(from._internal_lookuptablequantization());
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.QuantizationParams)
}